

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DataViewDefault.cpp
# Opt level: O3

bool __thiscall Rml::DataViewChecked::Update(DataViewChecked *this,DataModel *model)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  code *pcVar2;
  _Alloc_hider _Var3;
  size_type sVar4;
  bool bVar5;
  int iVar6;
  Element *element;
  DataExpression *this_00;
  char cVar7;
  String value;
  Variant variant;
  DataExpressionInterface expr_interface;
  String local_110;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_f0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b0;
  String local_90;
  Variant local_70;
  DataExpressionInterface local_48;
  
  Variant::Variant(&local_70);
  element = DataView::GetElement((DataView *)this);
  DataExpressionInterface::DataExpressionInterface(&local_48,model,element,(Event *)0x0);
  if (element != (Element *)0x0) {
    this_00 = (this->super_DataViewCommon).expression._M_t.
              super___uniq_ptr_impl<Rml::DataExpression,_std::default_delete<Rml::DataExpression>_>.
              _M_t.
              super__Tuple_impl<0UL,_Rml::DataExpression_*,_std::default_delete<Rml::DataExpression>_>
              .super__Head_base<0UL,_Rml::DataExpression_*,_false>._M_head_impl;
    if (this_00 == (DataExpression *)0x0) {
      bVar5 = Assert("RMLUI_ASSERT(expression)",
                     "/workspace/llm4binary/github/license_c_cmakelists/mikke89[P]RmlUi/Source/Core/DataViewDefault.cpp"
                     ,0x4f);
      if (!bVar5) {
        pcVar2 = (code *)invalidInstructionException();
        (*pcVar2)();
      }
      this_00 = (this->super_DataViewCommon).expression._M_t.
                super___uniq_ptr_impl<Rml::DataExpression,_std::default_delete<Rml::DataExpression>_>
                ._M_t.
                super__Tuple_impl<0UL,_Rml::DataExpression_*,_std::default_delete<Rml::DataExpression>_>
                .super__Head_base<0UL,_Rml::DataExpression_*,_false>._M_head_impl;
    }
    bVar5 = DataExpression::Run(this_00,&local_48,&local_70);
    if (bVar5) {
      if (local_70.type == BOOL) {
        local_110._M_dataplus._M_p = local_110._M_dataplus._M_p & 0xffffffffffffff00;
        Variant::GetInto<bool,_0>(&local_70,(bool *)&local_110);
        cVar7 = (char)local_110._M_dataplus._M_p;
      }
      else {
        paVar1 = &local_d0.field_2;
        local_d0._M_string_length = 0;
        local_d0.field_2._M_allocated_capacity._0_4_ =
             local_d0.field_2._M_allocated_capacity._0_4_ & 0xffffff00;
        local_d0._M_dataplus._M_p = (pointer)paVar1;
        Variant::
        GetInto<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0>
                  (&local_70,&local_d0);
        sVar4 = local_d0._M_string_length;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_d0._M_dataplus._M_p == paVar1) {
          local_110.field_2._8_4_ = local_d0.field_2._8_4_;
          local_110.field_2._12_4_ = local_d0.field_2._12_4_;
          local_d0._M_dataplus._M_p = (pointer)&local_110.field_2;
        }
        local_110.field_2._M_allocated_capacity._4_4_ = local_d0.field_2._M_allocated_capacity._4_4_
        ;
        local_110.field_2._M_allocated_capacity._0_4_ = local_d0.field_2._M_allocated_capacity._0_4_
        ;
        local_110._M_string_length = local_d0._M_string_length;
        local_d0._M_string_length = 0;
        local_d0.field_2._M_allocated_capacity._0_4_ =
             local_d0.field_2._M_allocated_capacity._0_4_ & 0xffffff00;
        local_110._M_dataplus._M_p = local_d0._M_dataplus._M_p;
        if (sVar4 == 0) {
          cVar7 = false;
          local_d0._M_dataplus._M_p = (pointer)paVar1;
        }
        else {
          local_d0._M_dataplus._M_p = (pointer)paVar1;
          local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
          ::std::__cxx11::string::_M_construct<char_const*>((string *)&local_90,"value","");
          local_b0._M_dataplus._M_p = (pointer)&local_b0.field_2;
          ::std::__cxx11::string::_M_construct<char_const*>((string *)&local_b0,"");
          Element::GetAttribute<std::__cxx11::string>(&local_f0,element,&local_90,&local_b0);
          _Var3._M_p = local_f0._M_dataplus._M_p;
          if (local_110._M_string_length == local_f0._M_string_length) {
            if (local_110._M_string_length == 0) {
              cVar7 = true;
            }
            else {
              iVar6 = bcmp(local_110._M_dataplus._M_p,local_f0._M_dataplus._M_p,
                           local_110._M_string_length);
              cVar7 = iVar6 == 0;
            }
          }
          else {
            cVar7 = false;
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)_Var3._M_p != &local_f0.field_2) {
            operator_delete(_Var3._M_p,
                            CONCAT71(local_f0.field_2._M_allocated_capacity._1_7_,
                                     local_f0.field_2._M_local_buf[0]) + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
            operator_delete(local_b0._M_dataplus._M_p,local_b0.field_2._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_90._M_dataplus._M_p != &local_90.field_2) {
            operator_delete(local_90._M_dataplus._M_p,local_90.field_2._M_allocated_capacity + 1);
          }
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_110._M_dataplus._M_p != &local_110.field_2) {
          operator_delete(local_110._M_dataplus._M_p,local_110.field_2._M_allocated_capacity + 1);
        }
      }
      paVar1 = &local_110.field_2;
      local_110._M_dataplus._M_p = (pointer)paVar1;
      ::std::__cxx11::string::_M_construct<char_const*>((string *)&local_110,"checked","");
      bVar5 = Element::HasAttribute(element,&local_110);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_110._M_dataplus._M_p != paVar1) {
        operator_delete(local_110._M_dataplus._M_p,local_110.field_2._M_allocated_capacity + 1);
      }
      if ((bool)cVar7 != bVar5) {
        if (cVar7 == '\0') {
          local_110._M_dataplus._M_p = (pointer)paVar1;
          ::std::__cxx11::string::_M_construct<char_const*>((string *)&local_110,"checked","");
          Element::RemoveAttribute(element,&local_110);
        }
        else {
          local_110._M_dataplus._M_p = (pointer)paVar1;
          ::std::__cxx11::string::_M_construct<char_const*>((string *)&local_110,"checked","");
          local_f0._M_string_length = 0;
          local_f0.field_2._M_local_buf[0] = '\0';
          local_f0._M_dataplus._M_p = (pointer)&local_f0.field_2;
          Element::SetAttribute<std::__cxx11::string>(element,&local_110,&local_f0);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_f0._M_dataplus._M_p != &local_f0.field_2) {
            operator_delete(local_f0._M_dataplus._M_p,
                            CONCAT71(local_f0.field_2._M_allocated_capacity._1_7_,
                                     local_f0.field_2._M_local_buf[0]) + 1);
          }
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_110._M_dataplus._M_p != paVar1) {
          operator_delete(local_110._M_dataplus._M_p,local_110.field_2._M_allocated_capacity + 1);
        }
        bVar5 = true;
        goto LAB_00202e0a;
      }
    }
  }
  bVar5 = false;
LAB_00202e0a:
  Variant::~Variant(&local_70);
  return bVar5;
}

Assistant:

bool DataViewChecked::Update(DataModel& model)
{
	bool result = false;
	Variant variant;
	Element* element = GetElement();
	DataExpressionInterface expr_interface(&model, element);

	if (element && GetExpression().Run(expr_interface, variant))
	{
		bool new_checked_state = false;

		if (variant.GetType() == Variant::BOOL)
		{
			new_checked_state = variant.Get<bool>();
		}
		else
		{
			const String value = variant.Get<String>();
			new_checked_state = (!value.empty() && value == element->GetAttribute<String>("value", ""));
		}

		const bool current_checked_state = element->HasAttribute("checked");

		if (new_checked_state != current_checked_state)
		{
			result = true;
			if (new_checked_state)
				element->SetAttribute("checked", String());
			else
				element->RemoveAttribute("checked");
		}
	}

	return result;
}